

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5IndexReinit(Fts5Index *p)

{
  int iVar1;
  Fts5Structure s;
  
  fts5StructureInvalidate(p);
  s.nSegment = 0;
  s.nLevel = 0;
  s.aLevel[0].nMerge = 0;
  s.aLevel[0].nSeg = 0;
  s.nRef = 0;
  s._4_4_ = 0;
  s.nWriteCounter = 0;
  s.aLevel[0].aSeg = (Fts5StructureSegment *)0x0;
  fts5DataWrite(p,1,"",0);
  fts5StructureWrite(p,&s);
  iVar1 = p->rc;
  p->rc = 0;
  return iVar1;
}

Assistant:

static int sqlite3Fts5IndexReinit(Fts5Index *p){
  Fts5Structure s;
  fts5StructureInvalidate(p);
  memset(&s, 0, sizeof(Fts5Structure));
  fts5DataWrite(p, FTS5_AVERAGES_ROWID, (const u8*)"", 0);
  fts5StructureWrite(p, &s);
  return fts5IndexReturn(p);
}